

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_mathutils.cc
# Opt level: O3

SpatialMatrix *
RigidBodyDynamics::Math::Xrotx_mat(SpatialMatrix *__return_storage_ptr__,double *xrot)

{
  double dVar1;
  double dVar2;
  undefined4 local_28;
  undefined4 uStack_24;
  
  dVar1 = sin(*xrot);
  dVar2 = cos(*xrot);
  local_28 = SUB84(dVar1,0);
  uStack_24 = (undefined4)((ulong)dVar1 >> 0x20);
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] = 1.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[7] = dVar2;
  *(undefined4 *)
   ((__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array + 0xd) =
       local_28;
  *(undefined4 *)
   ((long)(__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array + 0x6c
   ) = uStack_24;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x1e] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x1f] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[8] = -dVar1;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xe] = dVar2;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x13] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x14] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x19] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x1a] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x1b] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x20] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x21] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[9] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[10] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xf] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x10] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x15] = 1.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x16] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x1c] = dVar2;
  *(undefined4 *)
   ((__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array + 0x22) =
       local_28;
  *(undefined4 *)
   ((long)(__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array +
   0x114) = uStack_24;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xb] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xc] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x11] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x12] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x17] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x18] = 0.0;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x1d] = -dVar1
  ;
  (__return_storage_ptr__->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x23] = dVar2;
  return __return_storage_ptr__;
}

Assistant:

RBDL_DLLAPI
SpatialMatrix Xrotx_mat (const double &xrot) {
	double s, c;
	s = sin (xrot);
	c = cos (xrot);

	return SpatialMatrix(
			   1.,    0.,    0.,  0.,  0.,  0.,
			   0.,     c,     s,  0.,  0.,  0.,
			   0.,    -s,     c,  0.,  0.,  0.,
			   0.,    0.,    0.,  1.,  0.,  0.,
			   0.,    0.,    0.,  0.,   c,   s,
			   0.,    0.,    0.,  0.,  -s,   c
			);
}